

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLoop1(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  Arena *pAVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this_00;
  ArenaStringPtr *pAVar4;
  NeuralNetworkLayer *pNVar5;
  ActivationParams *this_01;
  NeuralNetwork *this_02;
  LoopLayerParams *this_03;
  NeuralNetwork *this_04;
  ostream *poVar6;
  undefined1 local_160 [8];
  Result res;
  NeuralNetworkLayer *l3;
  LoopLayerParams *loop_params;
  NeuralNetworkLayer *l2;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnBody;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this->name_,"A",pAVar2);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnBody._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar4 = &((FeatureDescription *)nnBody._80_8_)->name_;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)nnBody._80_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,"B",pAVar2);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnBody._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(this_01);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pNVar5->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar5->name_,"relu",pAVar2);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  this_02 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_02,EXACT_ARRAY_MAPPING);
  pNVar5 = CoreML::Specification::NeuralNetwork::add_layers(this_02);
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&pNVar5->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar5->name_,"for_loop",pAVar2);
  this_03 = CoreML::Specification::NeuralNetworkLayer::mutable_loop(pNVar5);
  this_04 = CoreML::Specification::LoopLayerParams::mutable_bodynetwork(this_03);
  CoreML::Specification::NeuralNetwork::CopyFrom(this_04,(NeuralNetwork *)&l1);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetwork::add_layers(this_02);
  pAVar4 = &((NeuralNetworkLayer *)res.m_message.field_2._8_8_)->name_;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation
                     ((MessageLite *)res.m_message.field_2._8_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,"copy",pAVar2);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_,"B");
  CoreML::Specification::NeuralNetworkLayer::mutable_copy
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::validate<(MLModelType)500>((Result *)local_160,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_160);
  if (m._oneof_case_[0]._0_1_) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11b1);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_160);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLoop1() {
    /*
     no input, no condition network, 0 max loop
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();


    Specification::NeuralNetwork nnBody;
    auto *l1 = nnBody.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("relu");
    l1->add_input("A");
    l1->add_output("B");

    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l2 = nnMain->add_layers();
    l2->set_name("for_loop");
    auto *loop_params = l2->mutable_loop();
    loop_params->mutable_bodynetwork()->CopyFrom(nnBody);

    auto *l3 = nnMain->add_layers();
    l3->set_name("copy");
    l3->add_input("A");
    l3->add_output("B");
    (void) l3->mutable_copy();

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}